

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_SHA3.c
# Opt level: O2

void Hacl_Hash_SHA3_update_last_sha3
               (Spec_Hash_Definitions_hash_alg a,uint64_t *s,uint8_t *input,uint32_t input_len)

{
  ulong __n;
  byte bVar1;
  uint32_t uVar2;
  uint32_t i;
  long lVar3;
  ulong local_338;
  uint8_t auStack_330 [8];
  uint8_t local_328 [8];
  uint8_t auStack_320 [8];
  uint8_t local_318 [8];
  uint8_t auStack_310 [8];
  uint8_t local_308 [8];
  uint8_t auStack_300 [8];
  uint8_t local_2f8 [8];
  uint8_t auStack_2f0 [8];
  uint8_t local_2e8 [8];
  uint8_t auStack_2e0 [8];
  uint8_t local_2d8 [8];
  uint8_t auStack_2d0 [8];
  uint8_t local_2c8 [8];
  uint8_t auStack_2c0 [8];
  uint8_t local_2b8 [8];
  uint8_t auStack_2b0 [8];
  uint8_t local_2a8 [8];
  uint8_t auStack_2a0 [8];
  uint8_t local_298 [8];
  uint8_t auStack_290 [8];
  uint8_t local_288 [8];
  uint8_t auStack_280 [8];
  uint8_t local_278 [8];
  uint8_t auStack_270 [8];
  uint8_t local_268 [8];
  uint8_t auStack_260 [8];
  uint8_t local_258 [8];
  uint8_t auStack_250 [8];
  uint8_t local_248 [8];
  uint8_t auStack_240 [7];
  uint8_t uStack_239;
  uint8_t b2 [256];
  uint8_t b1 [256];
  
  bVar1 = 6;
  if ((a & 0xfe) == 0xc) {
    bVar1 = 0x1f;
  }
  uVar2 = block_len(a);
  if (uVar2 == input_len) {
    memset(b1,0,0x100);
    memcpy(b1,input,(ulong)input_len);
    absorb_inner_32(b1,s);
    local_338 = (ulong)bVar1;
    memset(auStack_330,0,0xf8);
    for (lVar3 = 0; lVar3 != 0x19; lVar3 = lVar3 + 1) {
      s[lVar3] = s[lVar3] ^ (&local_338)[lVar3];
    }
    memset(b2,0,0x100);
    b2[(ulong)input_len - 1] = 0x80;
  }
  else {
    memset(b1,0,0x100);
    __n = (ulong)input_len % (ulong)uVar2;
    memcpy(b1,input + (input_len - __n),__n);
    b1[__n] = bVar1;
    local_338._0_1_ = b1[0];
    local_338._1_1_ = b1[1];
    local_338._2_1_ = b1[2];
    local_338._3_1_ = b1[3];
    local_338._4_1_ = b1[4];
    local_338._5_1_ = b1[5];
    local_338._6_1_ = b1[6];
    local_338._7_1_ = b1[7];
    auStack_330[0] = b1[8];
    auStack_330[1] = b1[9];
    auStack_330[2] = b1[10];
    auStack_330[3] = b1[0xb];
    auStack_330[4] = b1[0xc];
    auStack_330[5] = b1[0xd];
    auStack_330[6] = b1[0xe];
    auStack_330[7] = b1[0xf];
    local_328[0] = b1[0x10];
    local_328[1] = b1[0x11];
    local_328[2] = b1[0x12];
    local_328[3] = b1[0x13];
    local_328[4] = b1[0x14];
    local_328[5] = b1[0x15];
    local_328[6] = b1[0x16];
    local_328[7] = b1[0x17];
    auStack_320[0] = b1[0x18];
    auStack_320[1] = b1[0x19];
    auStack_320[2] = b1[0x1a];
    auStack_320[3] = b1[0x1b];
    auStack_320[4] = b1[0x1c];
    auStack_320[5] = b1[0x1d];
    auStack_320[6] = b1[0x1e];
    auStack_320[7] = b1[0x1f];
    local_318[0] = b1[0x20];
    local_318[1] = b1[0x21];
    local_318[2] = b1[0x22];
    local_318[3] = b1[0x23];
    local_318[4] = b1[0x24];
    local_318[5] = b1[0x25];
    local_318[6] = b1[0x26];
    local_318[7] = b1[0x27];
    auStack_310[0] = b1[0x28];
    auStack_310[1] = b1[0x29];
    auStack_310[2] = b1[0x2a];
    auStack_310[3] = b1[0x2b];
    auStack_310[4] = b1[0x2c];
    auStack_310[5] = b1[0x2d];
    auStack_310[6] = b1[0x2e];
    auStack_310[7] = b1[0x2f];
    local_308[0] = b1[0x30];
    local_308[1] = b1[0x31];
    local_308[2] = b1[0x32];
    local_308[3] = b1[0x33];
    local_308[4] = b1[0x34];
    local_308[5] = b1[0x35];
    local_308[6] = b1[0x36];
    local_308[7] = b1[0x37];
    auStack_300[0] = b1[0x38];
    auStack_300[1] = b1[0x39];
    auStack_300[2] = b1[0x3a];
    auStack_300[3] = b1[0x3b];
    auStack_300[4] = b1[0x3c];
    auStack_300[5] = b1[0x3d];
    auStack_300[6] = b1[0x3e];
    auStack_300[7] = b1[0x3f];
    local_2f8[0] = b1[0x40];
    local_2f8[1] = b1[0x41];
    local_2f8[2] = b1[0x42];
    local_2f8[3] = b1[0x43];
    local_2f8[4] = b1[0x44];
    local_2f8[5] = b1[0x45];
    local_2f8[6] = b1[0x46];
    local_2f8[7] = b1[0x47];
    auStack_2f0[0] = b1[0x48];
    auStack_2f0[1] = b1[0x49];
    auStack_2f0[2] = b1[0x4a];
    auStack_2f0[3] = b1[0x4b];
    auStack_2f0[4] = b1[0x4c];
    auStack_2f0[5] = b1[0x4d];
    auStack_2f0[6] = b1[0x4e];
    auStack_2f0[7] = b1[0x4f];
    local_2e8[0] = b1[0x50];
    local_2e8[1] = b1[0x51];
    local_2e8[2] = b1[0x52];
    local_2e8[3] = b1[0x53];
    local_2e8[4] = b1[0x54];
    local_2e8[5] = b1[0x55];
    local_2e8[6] = b1[0x56];
    local_2e8[7] = b1[0x57];
    auStack_2e0[0] = b1[0x58];
    auStack_2e0[1] = b1[0x59];
    auStack_2e0[2] = b1[0x5a];
    auStack_2e0[3] = b1[0x5b];
    auStack_2e0[4] = b1[0x5c];
    auStack_2e0[5] = b1[0x5d];
    auStack_2e0[6] = b1[0x5e];
    auStack_2e0[7] = b1[0x5f];
    local_2d8[0] = b1[0x60];
    local_2d8[1] = b1[0x61];
    local_2d8[2] = b1[0x62];
    local_2d8[3] = b1[99];
    local_2d8[4] = b1[100];
    local_2d8[5] = b1[0x65];
    local_2d8[6] = b1[0x66];
    local_2d8[7] = b1[0x67];
    auStack_2d0[0] = b1[0x68];
    auStack_2d0[1] = b1[0x69];
    auStack_2d0[2] = b1[0x6a];
    auStack_2d0[3] = b1[0x6b];
    auStack_2d0[4] = b1[0x6c];
    auStack_2d0[5] = b1[0x6d];
    auStack_2d0[6] = b1[0x6e];
    auStack_2d0[7] = b1[0x6f];
    local_2c8[0] = b1[0x70];
    local_2c8[1] = b1[0x71];
    local_2c8[2] = b1[0x72];
    local_2c8[3] = b1[0x73];
    local_2c8[4] = b1[0x74];
    local_2c8[5] = b1[0x75];
    local_2c8[6] = b1[0x76];
    local_2c8[7] = b1[0x77];
    auStack_2c0[0] = b1[0x78];
    auStack_2c0[1] = b1[0x79];
    auStack_2c0[2] = b1[0x7a];
    auStack_2c0[3] = b1[0x7b];
    auStack_2c0[4] = b1[0x7c];
    auStack_2c0[5] = b1[0x7d];
    auStack_2c0[6] = b1[0x7e];
    auStack_2c0[7] = b1[0x7f];
    local_2b8[0] = b1[0x80];
    local_2b8[1] = b1[0x81];
    local_2b8[2] = b1[0x82];
    local_2b8[3] = b1[0x83];
    local_2b8[4] = b1[0x84];
    local_2b8[5] = b1[0x85];
    local_2b8[6] = b1[0x86];
    local_2b8[7] = b1[0x87];
    auStack_2b0[0] = b1[0x88];
    auStack_2b0[1] = b1[0x89];
    auStack_2b0[2] = b1[0x8a];
    auStack_2b0[3] = b1[0x8b];
    auStack_2b0[4] = b1[0x8c];
    auStack_2b0[5] = b1[0x8d];
    auStack_2b0[6] = b1[0x8e];
    auStack_2b0[7] = b1[0x8f];
    local_2a8[0] = b1[0x90];
    local_2a8[1] = b1[0x91];
    local_2a8[2] = b1[0x92];
    local_2a8[3] = b1[0x93];
    local_2a8[4] = b1[0x94];
    local_2a8[5] = b1[0x95];
    local_2a8[6] = b1[0x96];
    local_2a8[7] = b1[0x97];
    auStack_2a0[0] = b1[0x98];
    auStack_2a0[1] = b1[0x99];
    auStack_2a0[2] = b1[0x9a];
    auStack_2a0[3] = b1[0x9b];
    auStack_2a0[4] = b1[0x9c];
    auStack_2a0[5] = b1[0x9d];
    auStack_2a0[6] = b1[0x9e];
    auStack_2a0[7] = b1[0x9f];
    local_298[0] = b1[0xa0];
    local_298[1] = b1[0xa1];
    local_298[2] = b1[0xa2];
    local_298[3] = b1[0xa3];
    local_298[4] = b1[0xa4];
    local_298[5] = b1[0xa5];
    local_298[6] = b1[0xa6];
    local_298[7] = b1[0xa7];
    auStack_290[0] = b1[0xa8];
    auStack_290[1] = b1[0xa9];
    auStack_290[2] = b1[0xaa];
    auStack_290[3] = b1[0xab];
    auStack_290[4] = b1[0xac];
    auStack_290[5] = b1[0xad];
    auStack_290[6] = b1[0xae];
    auStack_290[7] = b1[0xaf];
    local_288[0] = b1[0xb0];
    local_288[1] = b1[0xb1];
    local_288[2] = b1[0xb2];
    local_288[3] = b1[0xb3];
    local_288[4] = b1[0xb4];
    local_288[5] = b1[0xb5];
    local_288[6] = b1[0xb6];
    local_288[7] = b1[0xb7];
    auStack_280[0] = b1[0xb8];
    auStack_280[1] = b1[0xb9];
    auStack_280[2] = b1[0xba];
    auStack_280[3] = b1[0xbb];
    auStack_280[4] = b1[0xbc];
    auStack_280[5] = b1[0xbd];
    auStack_280[6] = b1[0xbe];
    auStack_280[7] = b1[0xbf];
    local_278[0] = b1[0xc0];
    local_278[1] = b1[0xc1];
    local_278[2] = b1[0xc2];
    local_278[3] = b1[0xc3];
    local_278[4] = b1[0xc4];
    local_278[5] = b1[0xc5];
    local_278[6] = b1[0xc6];
    local_278[7] = b1[199];
    auStack_270[0] = b1[200];
    auStack_270[1] = b1[0xc9];
    auStack_270[2] = b1[0xca];
    auStack_270[3] = b1[0xcb];
    auStack_270[4] = b1[0xcc];
    auStack_270[5] = b1[0xcd];
    auStack_270[6] = b1[0xce];
    auStack_270[7] = b1[0xcf];
    local_268[0] = b1[0xd0];
    local_268[1] = b1[0xd1];
    local_268[2] = b1[0xd2];
    local_268[3] = b1[0xd3];
    local_268[4] = b1[0xd4];
    local_268[5] = b1[0xd5];
    local_268[6] = b1[0xd6];
    local_268[7] = b1[0xd7];
    auStack_260[0] = b1[0xd8];
    auStack_260[1] = b1[0xd9];
    auStack_260[2] = b1[0xda];
    auStack_260[3] = b1[0xdb];
    auStack_260[4] = b1[0xdc];
    auStack_260[5] = b1[0xdd];
    auStack_260[6] = b1[0xde];
    auStack_260[7] = b1[0xdf];
    local_258[0] = b1[0xe0];
    local_258[1] = b1[0xe1];
    local_258[2] = b1[0xe2];
    local_258[3] = b1[0xe3];
    local_258[4] = b1[0xe4];
    local_258[5] = b1[0xe5];
    local_258[6] = b1[0xe6];
    local_258[7] = b1[0xe7];
    auStack_250[0] = b1[0xe8];
    auStack_250[1] = b1[0xe9];
    auStack_250[2] = b1[0xea];
    auStack_250[3] = b1[0xeb];
    auStack_250[4] = b1[0xec];
    auStack_250[5] = b1[0xed];
    auStack_250[6] = b1[0xee];
    auStack_250[7] = b1[0xef];
    local_248[0] = b1[0xf0];
    local_248[1] = b1[0xf1];
    local_248[2] = b1[0xf2];
    local_248[3] = b1[0xf3];
    local_248[4] = b1[0xf4];
    local_248[5] = b1[0xf5];
    local_248[6] = b1[0xf6];
    local_248[7] = b1[0xf7];
    auStack_240[0] = b1[0xf8];
    auStack_240[1] = b1[0xf9];
    auStack_240[2] = b1[0xfa];
    auStack_240[3] = b1[0xfb];
    auStack_240[4] = b1[0xfc];
    auStack_240[5] = b1[0xfd];
    auStack_240[6] = b1[0xfe];
    uStack_239 = b1[0xff];
    for (lVar3 = 0; lVar3 != 0x19; lVar3 = lVar3 + 1) {
      s[lVar3] = s[lVar3] ^ (&local_338)[lVar3];
    }
    memset(b2,0,0x100);
    b2[(ulong)uVar2 - 1] = 0x80;
  }
  absorb_inner_32(b2,s);
  return;
}

Assistant:

void
Hacl_Hash_SHA3_update_last_sha3(
  Spec_Hash_Definitions_hash_alg a,
  uint64_t *s,
  uint8_t *input,
  uint32_t input_len
)
{
  uint8_t suffix;
  if (a == Spec_Hash_Definitions_Shake128 || a == Spec_Hash_Definitions_Shake256)
  {
    suffix = 0x1fU;
  }
  else
  {
    suffix = 0x06U;
  }
  uint32_t len = block_len(a);
  if (input_len == len)
  {
    uint8_t b1[256U] = { 0U };
    uint8_t *b_ = b1;
    uint8_t *b00 = input;
    uint8_t *bl00 = b_;
    memcpy(bl00, b00 + 0U * len, len * sizeof (uint8_t));
    absorb_inner_32(b_, s);
    uint8_t b2[256U] = { 0U };
    uint8_t *b_0 = b2;
    uint32_t rem = 0U % len;
    uint8_t *b01 = input + input_len;
    uint8_t *bl0 = b_0;
    memcpy(bl0, b01 + 0U - rem, rem * sizeof (uint8_t));
    uint8_t *b02 = b_0;
    b02[0U % len] = suffix;
    uint64_t ws[32U] = { 0U };
    uint8_t *b = b_0;
    uint64_t u = load64_le(b);
    ws[0U] = u;
    uint64_t u0 = load64_le(b + 8U);
    ws[1U] = u0;
    uint64_t u1 = load64_le(b + 16U);
    ws[2U] = u1;
    uint64_t u2 = load64_le(b + 24U);
    ws[3U] = u2;
    uint64_t u3 = load64_le(b + 32U);
    ws[4U] = u3;
    uint64_t u4 = load64_le(b + 40U);
    ws[5U] = u4;
    uint64_t u5 = load64_le(b + 48U);
    ws[6U] = u5;
    uint64_t u6 = load64_le(b + 56U);
    ws[7U] = u6;
    uint64_t u7 = load64_le(b + 64U);
    ws[8U] = u7;
    uint64_t u8 = load64_le(b + 72U);
    ws[9U] = u8;
    uint64_t u9 = load64_le(b + 80U);
    ws[10U] = u9;
    uint64_t u10 = load64_le(b + 88U);
    ws[11U] = u10;
    uint64_t u11 = load64_le(b + 96U);
    ws[12U] = u11;
    uint64_t u12 = load64_le(b + 104U);
    ws[13U] = u12;
    uint64_t u13 = load64_le(b + 112U);
    ws[14U] = u13;
    uint64_t u14 = load64_le(b + 120U);
    ws[15U] = u14;
    uint64_t u15 = load64_le(b + 128U);
    ws[16U] = u15;
    uint64_t u16 = load64_le(b + 136U);
    ws[17U] = u16;
    uint64_t u17 = load64_le(b + 144U);
    ws[18U] = u17;
    uint64_t u18 = load64_le(b + 152U);
    ws[19U] = u18;
    uint64_t u19 = load64_le(b + 160U);
    ws[20U] = u19;
    uint64_t u20 = load64_le(b + 168U);
    ws[21U] = u20;
    uint64_t u21 = load64_le(b + 176U);
    ws[22U] = u21;
    uint64_t u22 = load64_le(b + 184U);
    ws[23U] = u22;
    uint64_t u23 = load64_le(b + 192U);
    ws[24U] = u23;
    uint64_t u24 = load64_le(b + 200U);
    ws[25U] = u24;
    uint64_t u25 = load64_le(b + 208U);
    ws[26U] = u25;
    uint64_t u26 = load64_le(b + 216U);
    ws[27U] = u26;
    uint64_t u27 = load64_le(b + 224U);
    ws[28U] = u27;
    uint64_t u28 = load64_le(b + 232U);
    ws[29U] = u28;
    uint64_t u29 = load64_le(b + 240U);
    ws[30U] = u29;
    uint64_t u30 = load64_le(b + 248U);
    ws[31U] = u30;
    for (uint32_t i = 0U; i < 25U; i++)
    {
      s[i] = s[i] ^ ws[i];
    }
    if (!(((uint32_t)suffix & 0x80U) == 0U) && 0U % len == len - 1U)
    {
      for (uint32_t i0 = 0U; i0 < 24U; i0++)
      {
        uint64_t _C[5U] = { 0U };
        KRML_MAYBE_FOR5(i,
          0U,
          5U,
          1U,
          _C[i] = s[i + 0U] ^ (s[i + 5U] ^ (s[i + 10U] ^ (s[i + 15U] ^ s[i + 20U]))););
        KRML_MAYBE_FOR5(i1,
          0U,
          5U,
          1U,
          uint64_t uu____0 = _C[(i1 + 1U) % 5U];
          uint64_t _D = _C[(i1 + 4U) % 5U] ^ (uu____0 << 1U | uu____0 >> 63U);
          KRML_MAYBE_FOR5(i, 0U, 5U, 1U, s[i1 + 5U * i] = s[i1 + 5U * i] ^ _D;););
        uint64_t x = s[1U];
        uint64_t current = x;
        for (uint32_t i = 0U; i < 24U; i++)
        {
          uint32_t _Y = Hacl_Hash_SHA3_keccak_piln[i];
          uint32_t r = Hacl_Hash_SHA3_keccak_rotc[i];
          uint64_t temp = s[_Y];
          uint64_t uu____1 = current;
          s[_Y] = uu____1 << r | uu____1 >> (64U - r);
          current = temp;
        }
        KRML_MAYBE_FOR5(i,
          0U,
          5U,
          1U,
          uint64_t v0 = s[0U + 5U * i] ^ (~s[1U + 5U * i] & s[2U + 5U * i]);
          uint64_t v1 = s[1U + 5U * i] ^ (~s[2U + 5U * i] & s[3U + 5U * i]);
          uint64_t v2 = s[2U + 5U * i] ^ (~s[3U + 5U * i] & s[4U + 5U * i]);
          uint64_t v3 = s[3U + 5U * i] ^ (~s[4U + 5U * i] & s[0U + 5U * i]);
          uint64_t v4 = s[4U + 5U * i] ^ (~s[0U + 5U * i] & s[1U + 5U * i]);
          s[0U + 5U * i] = v0;
          s[1U + 5U * i] = v1;
          s[2U + 5U * i] = v2;
          s[3U + 5U * i] = v3;
          s[4U + 5U * i] = v4;);
        uint64_t c = Hacl_Hash_SHA3_keccak_rndc[i0];
        s[0U] = s[0U] ^ c;
      }
    }
    uint8_t b3[256U] = { 0U };
    uint8_t *b4 = b3;
    uint8_t *b0 = b4;
    b0[len - 1U] = 0x80U;
    absorb_inner_32(b4, s);
    return;
  }
  uint8_t b1[256U] = { 0U };
  uint8_t *b_ = b1;
  uint32_t rem = input_len % len;
  uint8_t *b00 = input;
  uint8_t *bl0 = b_;
  memcpy(bl0, b00 + input_len - rem, rem * sizeof (uint8_t));
  uint8_t *b01 = b_;
  b01[input_len % len] = suffix;
  uint64_t ws[32U] = { 0U };
  uint8_t *b = b_;
  uint64_t u = load64_le(b);
  ws[0U] = u;
  uint64_t u0 = load64_le(b + 8U);
  ws[1U] = u0;
  uint64_t u1 = load64_le(b + 16U);
  ws[2U] = u1;
  uint64_t u2 = load64_le(b + 24U);
  ws[3U] = u2;
  uint64_t u3 = load64_le(b + 32U);
  ws[4U] = u3;
  uint64_t u4 = load64_le(b + 40U);
  ws[5U] = u4;
  uint64_t u5 = load64_le(b + 48U);
  ws[6U] = u5;
  uint64_t u6 = load64_le(b + 56U);
  ws[7U] = u6;
  uint64_t u7 = load64_le(b + 64U);
  ws[8U] = u7;
  uint64_t u8 = load64_le(b + 72U);
  ws[9U] = u8;
  uint64_t u9 = load64_le(b + 80U);
  ws[10U] = u9;
  uint64_t u10 = load64_le(b + 88U);
  ws[11U] = u10;
  uint64_t u11 = load64_le(b + 96U);
  ws[12U] = u11;
  uint64_t u12 = load64_le(b + 104U);
  ws[13U] = u12;
  uint64_t u13 = load64_le(b + 112U);
  ws[14U] = u13;
  uint64_t u14 = load64_le(b + 120U);
  ws[15U] = u14;
  uint64_t u15 = load64_le(b + 128U);
  ws[16U] = u15;
  uint64_t u16 = load64_le(b + 136U);
  ws[17U] = u16;
  uint64_t u17 = load64_le(b + 144U);
  ws[18U] = u17;
  uint64_t u18 = load64_le(b + 152U);
  ws[19U] = u18;
  uint64_t u19 = load64_le(b + 160U);
  ws[20U] = u19;
  uint64_t u20 = load64_le(b + 168U);
  ws[21U] = u20;
  uint64_t u21 = load64_le(b + 176U);
  ws[22U] = u21;
  uint64_t u22 = load64_le(b + 184U);
  ws[23U] = u22;
  uint64_t u23 = load64_le(b + 192U);
  ws[24U] = u23;
  uint64_t u24 = load64_le(b + 200U);
  ws[25U] = u24;
  uint64_t u25 = load64_le(b + 208U);
  ws[26U] = u25;
  uint64_t u26 = load64_le(b + 216U);
  ws[27U] = u26;
  uint64_t u27 = load64_le(b + 224U);
  ws[28U] = u27;
  uint64_t u28 = load64_le(b + 232U);
  ws[29U] = u28;
  uint64_t u29 = load64_le(b + 240U);
  ws[30U] = u29;
  uint64_t u30 = load64_le(b + 248U);
  ws[31U] = u30;
  for (uint32_t i = 0U; i < 25U; i++)
  {
    s[i] = s[i] ^ ws[i];
  }
  if (!(((uint32_t)suffix & 0x80U) == 0U) && input_len % len == len - 1U)
  {
    for (uint32_t i0 = 0U; i0 < 24U; i0++)
    {
      uint64_t _C[5U] = { 0U };
      KRML_MAYBE_FOR5(i,
        0U,
        5U,
        1U,
        _C[i] = s[i + 0U] ^ (s[i + 5U] ^ (s[i + 10U] ^ (s[i + 15U] ^ s[i + 20U]))););
      KRML_MAYBE_FOR5(i1,
        0U,
        5U,
        1U,
        uint64_t uu____2 = _C[(i1 + 1U) % 5U];
        uint64_t _D = _C[(i1 + 4U) % 5U] ^ (uu____2 << 1U | uu____2 >> 63U);
        KRML_MAYBE_FOR5(i, 0U, 5U, 1U, s[i1 + 5U * i] = s[i1 + 5U * i] ^ _D;););
      uint64_t x = s[1U];
      uint64_t current = x;
      for (uint32_t i = 0U; i < 24U; i++)
      {
        uint32_t _Y = Hacl_Hash_SHA3_keccak_piln[i];
        uint32_t r = Hacl_Hash_SHA3_keccak_rotc[i];
        uint64_t temp = s[_Y];
        uint64_t uu____3 = current;
        s[_Y] = uu____3 << r | uu____3 >> (64U - r);
        current = temp;
      }
      KRML_MAYBE_FOR5(i,
        0U,
        5U,
        1U,
        uint64_t v0 = s[0U + 5U * i] ^ (~s[1U + 5U * i] & s[2U + 5U * i]);
        uint64_t v1 = s[1U + 5U * i] ^ (~s[2U + 5U * i] & s[3U + 5U * i]);
        uint64_t v2 = s[2U + 5U * i] ^ (~s[3U + 5U * i] & s[4U + 5U * i]);
        uint64_t v3 = s[3U + 5U * i] ^ (~s[4U + 5U * i] & s[0U + 5U * i]);
        uint64_t v4 = s[4U + 5U * i] ^ (~s[0U + 5U * i] & s[1U + 5U * i]);
        s[0U + 5U * i] = v0;
        s[1U + 5U * i] = v1;
        s[2U + 5U * i] = v2;
        s[3U + 5U * i] = v3;
        s[4U + 5U * i] = v4;);
      uint64_t c = Hacl_Hash_SHA3_keccak_rndc[i0];
      s[0U] = s[0U] ^ c;
    }
  }
  uint8_t b2[256U] = { 0U };
  uint8_t *b3 = b2;
  uint8_t *b0 = b3;
  b0[len - 1U] = 0x80U;
  absorb_inner_32(b3, s);
}